

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O2

void * t_pool_worker(void *arg)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  int *piVar2;
  undefined8 *__ptr;
  long lVar3;
  undefined8 *puVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  ulong uVar9;
  ulong uVar10;
  
  piVar2 = *arg;
  __mutex = (pthread_mutex_t *)(piVar2 + 0xc);
  do {
    pthread_mutex_lock(__mutex);
    while( true ) {
      __ptr = *(undefined8 **)(piVar2 + 4);
      if (__ptr != (undefined8 *)0x0) break;
      if (piVar2[3] != 0) goto LAB_0012b65c;
      piVar2[2] = piVar2[2] + 1;
      if (piVar2[1] == 0) {
        pthread_cond_signal((pthread_cond_t *)(piVar2 + 0x16));
      }
      iVar5 = *(int *)((long)arg + 8);
      if (iVar5 < piVar2[0x3c] || piVar2[0x3c] == -1) {
        piVar2[0x3c] = iVar5;
      }
      *(undefined4 *)(*(long *)(piVar2 + 0x3a) + (long)iVar5 * 4) = 1;
      pthread_cond_wait((pthread_cond_t *)((long)arg + 0x18),__mutex);
      lVar3 = *(long *)(piVar2 + 0x3a);
      *(undefined4 *)(lVar3 + (long)*(int *)((long)arg + 8) * 4) = 0;
      piVar2[0x3c] = -1;
      uVar9 = (ulong)(uint)piVar2[8];
      if (piVar2[8] < 1) {
        uVar9 = 0;
      }
      for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        if (*(int *)(lVar3 + uVar10 * 4) != 0) {
          piVar2[0x3c] = (int)uVar10;
          break;
        }
      }
      piVar2[2] = piVar2[2] + -1;
    }
    if (piVar2[3] != 0) {
LAB_0012b65c:
      pthread_mutex_unlock(__mutex);
      pthread_exit((void *)0x0);
    }
    lVar3 = __ptr[2];
    *(long *)(piVar2 + 4) = lVar3;
    if (lVar3 == 0) {
      piVar2[6] = 0;
      piVar2[7] = 0;
    }
    iVar1 = piVar2[1];
    iVar5 = iVar1 + -1;
    piVar2[1] = iVar5;
    if (*piVar2 <= iVar1) {
      pthread_cond_signal((pthread_cond_t *)(piVar2 + 0x2e));
      iVar5 = piVar2[1];
    }
    if (iVar5 == 0) {
      pthread_cond_signal((pthread_cond_t *)(piVar2 + 0x16));
    }
    pthread_mutex_unlock(__mutex);
    uVar6 = (*(code *)*__ptr)(__ptr[1]);
    puVar4 = (undefined8 *)__ptr[4];
    if (puVar4 != (undefined8 *)0x0) {
      puVar7 = (undefined8 *)malloc(0x18);
      if (puVar7 != (undefined8 *)0x0) {
        *puVar7 = 0;
        puVar7[2] = uVar6;
        *(undefined4 *)(puVar7 + 1) = *(undefined4 *)(__ptr + 5);
        pthread_mutex_lock((pthread_mutex_t *)(puVar4 + 4));
        puVar8 = (undefined8 *)puVar4[1];
        if ((undefined8 *)puVar4[1] == (undefined8 *)0x0) {
          puVar8 = puVar4;
        }
        *puVar8 = puVar7;
        puVar4[1] = puVar7;
        puVar4[3] = CONCAT44((int)((ulong)puVar4[3] >> 0x20) + -1,(int)puVar4[3] + 1);
        pthread_cond_signal((pthread_cond_t *)(puVar4 + 9));
        pthread_mutex_unlock((pthread_mutex_t *)(puVar4 + 4));
      }
    }
    free(__ptr);
  } while( true );
}

Assistant:

static void *t_pool_worker(void *arg) {
    t_pool_worker_t *w = (t_pool_worker_t *)arg;
    t_pool *p = w->p;
    t_pool_job *j;
#ifdef DEBUG_TIME
    struct timeval t1, t2, t3;
#endif

    for (;;) {
	// Pop an item off the pool queue
#ifdef DEBUG_TIME
	gettimeofday(&t1, NULL);
#endif

	pthread_mutex_lock(&p->pool_m);

#ifdef DEBUG_TIME
	gettimeofday(&t2, NULL);
	p->wait_time += TDIFF(t2,t1);
	w->wait_time += TDIFF(t2,t1);
#endif

	// If there is something on the job list and a higher priority
	// thread waiting, let it handle this instead.
//	while (p->head && p->t_stack_top != -1 && p->t_stack_top < w->idx) {
//	    pthread_mutex_unlock(&p->pool_m);
//	    pthread_cond_signal(&p->t[p->t_stack_top].pending_c);
//	    pthread_mutex_lock(&p->pool_m);
//	}

	while (!p->head && !p->shutdown) {
	    p->nwaiting++;

	    if (p->njobs == 0)
		pthread_cond_signal(&p->empty_c);
#ifdef DEBUG_TIME
	    gettimeofday(&t2, NULL);
#endif

#ifdef IN_ORDER
	    // Push this thread to the top of the waiting stack
	    if (p->t_stack_top == -1 || p->t_stack_top > w->idx)
		p->t_stack_top = w->idx;

	    p->t_stack[w->idx] = 1;
	    pthread_cond_wait(&w->pending_c, &p->pool_m);
	    p->t_stack[w->idx] = 0;

	    /* Find new t_stack_top */
	    {
		int i;
		p->t_stack_top = -1;
		for (i = 0; i < p->tsize; i++) {
		    if (p->t_stack[i]) {
			p->t_stack_top = i;
			break;
		    }
		}
	    }
#else
	    pthread_cond_wait(&p->pending_c, &p->pool_m);
#endif

#ifdef DEBUG_TIME
	    gettimeofday(&t3, NULL);
	    p->wait_time += TDIFF(t3,t2);
	    w->wait_time += TDIFF(t3,t2);
#endif
	    p->nwaiting--;
	}

	if (p->shutdown) {
#ifdef DEBUG_TIME
	    p->total_time += TDIFF(t3,t1);
#endif
#ifdef DEBUG
	    fprintf(stderr, "%d: Shutting down\n", worker_id(p));
#endif
	    pthread_mutex_unlock(&p->pool_m);
	    pthread_exit(NULL);
	}

	j = p->head;
	if (!(p->head = j->next))
	    p->tail = NULL;

	if (p->njobs-- >= p->qsize)
	    pthread_cond_signal(&p->full_c);

	if (p->njobs == 0)
	    pthread_cond_signal(&p->empty_c);

	pthread_mutex_unlock(&p->pool_m);
	    
	// We have job 'j' - now execute it.
	t_pool_add_result(j, j->func(j->arg));	
#ifdef DEBUG_TIME
	pthread_mutex_lock(&p->pool_m);
	gettimeofday(&t3, NULL);
	p->total_time += TDIFF(t3,t1);
	pthread_mutex_unlock(&p->pool_m);
#endif
	memset(j, 0xbb, sizeof(*j));
	free(j);
    }

    return NULL;
}